

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleListDecoder.h
# Opt level: O1

O3DGCErrorCode __thiscall
o3dgc::TriangleListDecoder<unsigned_short>::Decode
          (TriangleListDecoder<unsigned_short> *this,unsigned_short *triangles,long numTriangles,
          long numVertices,BinaryStream *bstream,unsigned_long *iterator)

{
  byte bVar1;
  O3DGCErrorCode OVar2;
  unsigned_long uVar3;
  bool bVar4;
  
  uVar3 = *iterator;
  *iterator = uVar3 + 1;
  bVar1 = (bstream->m_stream).m_buffer[uVar3];
  this->m_decodeTrianglesOrder = (bool)(bVar1 >> 1 & 1);
  OVar2 = O3DGC_ERROR_NON_SUPPORTED_FEATURE;
  bVar4 = (bool)(bVar1 & 1);
  this->m_decodeVerticesOrder = bVar4;
  if (bVar4 == false) {
    if (this->m_streamType == O3DGC_STREAM_TYPE_ASCII) {
      uVar3 = BinaryStream::ReadUInt32ASCII(bstream,iterator);
    }
    else {
      uVar3 = BinaryStream::ReadUInt32Bin(bstream,iterator);
    }
    Init(this,triangles,numTriangles,numVertices,uVar3);
    CompressedTriangleFans::Load
              (&this->m_ctfans,bstream,iterator,this->m_decodeTrianglesOrder,this->m_streamType);
    Decompress(this);
    OVar2 = O3DGC_OK;
  }
  return OVar2;
}

Assistant:

O3DGCErrorCode              Decode(T * const triangles,
                                           const long numTriangles,
                                           const long numVertices,
                                           const BinaryStream & bstream,
                                           unsigned long & iterator)
                                    {
                                        unsigned char compressionMask = bstream.ReadUChar(iterator, m_streamType); 
                                        m_decodeTrianglesOrder = ( (compressionMask&2) != 0);
                                        m_decodeVerticesOrder = ( (compressionMask&1) != 0); 
                                        if (m_decodeVerticesOrder)  // vertices reordering not supported
                                        {
                                            return O3DGC_ERROR_NON_SUPPORTED_FEATURE;
                                        }
                                        unsigned long maxSizeV2T = bstream.ReadUInt32(iterator, m_streamType);
                                        Init(triangles, numTriangles, numVertices, maxSizeV2T);
                                        m_ctfans.Load(bstream, iterator, m_decodeTrianglesOrder, m_streamType);
                                        Decompress();
                                        return O3DGC_OK;
                                    }